

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  utf8proc_ssize_t uVar4;
  ulong uVar5;
  utf8proc_ssize_t len_2;
  idx_t iVar6;
  utf8proc_ssize_t len;
  idx_t iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  anon_union_16_2_67f50693_for_value local_a0;
  ulong local_90;
  string_t *local_88;
  string_t *local_80;
  long *local_78;
  utf8proc_int32_t local_6c;
  ulong local_68;
  anon_union_16_2_67f50693_for_value local_60;
  ValidityMask *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_90 = count;
  local_88 = ldata;
  local_80 = rdata;
  local_78 = result_data;
  local_50 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = 0;
      do {
        local_a0._0_8_ = *(undefined8 *)&local_88[iVar3].value;
        local_a0.pointer.ptr = local_88[iVar3].value.pointer.ptr;
        local_60._0_8_ = *(undefined8 *)&local_80[iVar3].value;
        local_60.pointer.ptr = local_80[iVar3].value.pointer.ptr;
        iVar7 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
        if (iVar7 == 0xffffffffffffffff) {
          lVar10 = 0;
        }
        else if ((long)iVar7 < 1) {
          lVar10 = 1;
        }
        else {
          uVar9 = local_a0.pointer.prefix;
          if (0xc < local_a0.pointer.length) {
            uVar9 = local_a0.pointer.ptr;
          }
          lVar10 = 1;
          do {
            uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar7,&local_6c);
            uVar9 = uVar9 + uVar4;
            lVar10 = lVar10 + 1;
            iVar6 = iVar7 - uVar4;
            bVar2 = uVar4 <= (long)iVar7;
            iVar7 = iVar6;
          } while (iVar6 != 0 && bVar2);
        }
        local_78[iVar3] = lVar10;
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_90);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_68 = count + 0x3f >> 6;
    uVar11 = 0;
    local_48 = 0;
    do {
      puVar1 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar1[local_48];
      }
      uVar8 = uVar11 + 0x40;
      if (local_90 <= uVar11 + 0x40) {
        uVar8 = local_90;
      }
      uVar12 = uVar8;
      if (uVar5 != 0) {
        uVar12 = uVar11;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar11 < uVar8) {
            do {
              local_a0._0_8_ = *(undefined8 *)&local_88[uVar11].value;
              local_a0.pointer.ptr = local_88[uVar11].value.pointer.ptr;
              local_60._0_8_ = *(undefined8 *)&local_80[uVar11].value;
              local_60.pointer.ptr = local_80[uVar11].value.pointer.ptr;
              iVar3 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
              if (iVar3 == 0xffffffffffffffff) {
                lVar10 = 0;
              }
              else if ((long)iVar3 < 1) {
                lVar10 = 1;
              }
              else {
                uVar9 = local_a0.pointer.prefix;
                if (0xc < local_a0.pointer.length) {
                  uVar9 = local_a0.pointer.ptr;
                }
                lVar10 = 1;
                do {
                  uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar3,&local_6c);
                  uVar9 = uVar9 + uVar4;
                  lVar10 = lVar10 + 1;
                  iVar7 = iVar3 - uVar4;
                  bVar2 = uVar4 <= (long)iVar3;
                  iVar3 = iVar7;
                } while (iVar7 != 0 && bVar2);
              }
              local_78[uVar11] = lVar10;
              uVar11 = uVar11 + 1;
              uVar12 = uVar11;
            } while (uVar11 != uVar8);
          }
        }
        else {
          local_40 = uVar5;
          local_38 = uVar11;
          if (uVar11 < uVar8) {
            do {
              if ((uVar5 >> ((ulong)(uint)((int)uVar12 - (int)uVar11) & 0x3f) & 1) != 0) {
                local_a0._0_8_ = *(undefined8 *)&local_88[uVar12].value;
                local_a0.pointer.ptr = local_88[uVar12].value.pointer.ptr;
                local_60._0_8_ = *(undefined8 *)&local_80[uVar12].value;
                local_60.pointer.ptr = local_80[uVar12].value.pointer.ptr;
                iVar3 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
                if (iVar3 == 0xffffffffffffffff) {
                  lVar10 = 0;
                }
                else if ((long)iVar3 < 1) {
                  lVar10 = 1;
                }
                else {
                  uVar9 = local_a0.pointer.prefix;
                  if (0xc < local_a0.pointer.length) {
                    uVar9 = local_a0.pointer.ptr;
                  }
                  lVar10 = 1;
                  do {
                    uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar3,&local_6c);
                    uVar9 = uVar9 + uVar4;
                    lVar10 = lVar10 + 1;
                    iVar7 = iVar3 - uVar4;
                    bVar2 = uVar4 <= (long)iVar3;
                    iVar3 = iVar7;
                  } while (iVar7 != 0 && bVar2);
                }
                local_78[uVar12] = lVar10;
                uVar5 = local_40;
                uVar11 = local_38;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar8);
          }
        }
      }
      uVar11 = uVar12;
      local_48 = local_48 + 1;
    } while (local_48 != local_68);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}